

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLString.cpp
# Opt level: O0

String * MathML::StringUtil::replaceAll(String *str,String *pattern,String *replacement)

{
  string *psVar1;
  ulong in_RDX;
  string *in_RSI;
  String *in_RDI;
  size_t position;
  String *string;
  undefined8 local_30;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  local_30 = std::__cxx11::string::find((string *)in_RDI,in_RDX);
  while (local_30 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)in_RDI,local_30,psVar1);
    local_30 = std::__cxx11::string::find((string *)in_RDI,in_RDX);
  }
  return in_RDI;
}

Assistant:

String StringUtil::replaceAll( const String& str, const String& pattern, const String& replacement )
    {
        String string = str;

        size_t position = string.find( pattern );

        while ( position != String::npos )
        {
            string.replace( position, pattern.size(), replacement );
            position = string.find( pattern );
        }

        return string;
    }